

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::unpalettize(Image *this,bool forceAlpha)

{
  bool32 bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  int32 y;
  int iVar4;
  uint8 *puVar5;
  uint uVar6;
  void *__ptr;
  long lVar7;
  uint8 *puVar8;
  int iVar9;
  
  if (this->depth < 9) {
    if (forceAlpha) {
      uVar6 = 0x20;
      bVar1 = 1;
    }
    else {
      bVar1 = hasAlpha(this);
      uVar6 = bVar1 * 8 + 0x18;
    }
    iVar9 = (int)(this->width * uVar6) >> 3;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 714"
    ;
    __ptr = (void *)0x30018;
    puVar2 = (uint8 *)(*DAT_00143848)((long)this->height * (long)iVar9);
    puVar3 = this->pixels;
    puVar5 = puVar2;
    for (iVar4 = 0; iVar4 < this->height; iVar4 = iVar4 + 1) {
      puVar8 = puVar5;
      for (lVar7 = 0; (int)lVar7 < this->width; lVar7 = lVar7 + 1) {
        *puVar8 = this->palette[(ulong)puVar3[lVar7] * 4];
        puVar8[1] = this->palette[(ulong)puVar3[lVar7] * 4 + 1];
        puVar8[2] = this->palette[(ulong)puVar3[lVar7] * 4 + 2];
        if ((char)bVar1 == '\0') {
          puVar8 = puVar8 + 3;
        }
        else {
          puVar8[3] = this->palette[(ulong)puVar3[lVar7] * 4 + 3];
          puVar8 = puVar8 + 4;
        }
      }
      __ptr = (void *)(long)this->stride;
      puVar3 = puVar3 + (long)__ptr;
      puVar5 = puVar5 + iVar9;
    }
    free(this,__ptr);
    this->depth = uVar6;
    this->bpp = uVar6 >> 3;
    this->stride = iVar9;
    this->pixels = puVar2;
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  return;
}

Assistant:

void
Image::unpalettize(bool forceAlpha)
{
	if(this->depth > 8)
		return;
	assert(this->pixels);
	assert(this->palette);

	int32 ndepth = (forceAlpha || this->hasAlpha()) ? 32 : 24;
	int32 nstride = this->width*ndepth/8;
	uint8 *npixels = rwNewT(uint8, nstride*this->height, MEMDUR_EVENT | ID_IMAGE);

	uint8 *line = this->pixels;
	uint8 *nline = npixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			np[0] = this->palette[*p*4+0];
			np[1] = this->palette[*p*4+1];
			np[2] = this->palette[*p*4+2];
			np += 3;
			if(ndepth == 32)
				*np++ = this->palette[*p*4+3];
			p++;
		}
		line += this->stride;
		nline += nstride;
	}
	this->free();
	this->depth = ndepth;
	this->bpp = ndepth < 8 ? 1 : ndepth/8;
	this->stride = nstride;
	this->setPixels(npixels);
}